

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O0

void __thiscall
llvm::ErrorList::ErrorList
          (ErrorList *this,
          unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *Payload1,
          unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *Payload2)

{
  bool bVar1;
  bool bVar2;
  pointer pEVar3;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *Payload2_local;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *Payload1_local;
  ErrorList *this_local;
  
  ErrorInfo<llvm::ErrorList,_llvm::ErrorInfoBase>::ErrorInfo
            (&this->super_ErrorInfo<llvm::ErrorList,_llvm::ErrorInfoBase>);
  (this->super_ErrorInfo<llvm::ErrorList,_llvm::ErrorInfoBase>).super_ErrorInfoBase.
  _vptr_ErrorInfoBase = (_func_int **)&PTR__ErrorList_0271e178;
  std::
  vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
  ::vector(&this->Payloads);
  pEVar3 = std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::
           operator->(Payload1);
  bVar2 = ErrorInfoBase::isA<llvm::ErrorList>(pEVar3);
  bVar1 = false;
  if (!bVar2) {
    pEVar3 = std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::
             operator->(Payload2);
    bVar2 = ErrorInfoBase::isA<llvm::ErrorList>(pEVar3);
    bVar1 = false;
    if (!bVar2) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("!Payload1->isA<ErrorList>() && !Payload2->isA<ErrorList>() && \"ErrorList constructor payloads should be singleton errors\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/Support/Error.h"
                  ,0x182,
                  "llvm::ErrorList::ErrorList(std::unique_ptr<ErrorInfoBase>, std::unique_ptr<ErrorInfoBase>)"
                 );
  }
  std::
  vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
  ::push_back(&this->Payloads,Payload1);
  std::
  vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
  ::push_back(&this->Payloads,Payload2);
  return;
}

Assistant:

ErrorList(std::unique_ptr<ErrorInfoBase> Payload1,
            std::unique_ptr<ErrorInfoBase> Payload2) {
    assert(!Payload1->isA<ErrorList>() && !Payload2->isA<ErrorList>() &&
           "ErrorList constructor payloads should be singleton errors");
    Payloads.push_back(std::move(Payload1));
    Payloads.push_back(std::move(Payload2));
  }